

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O1

void quantize_row_q2_K_ref(float *x,block_q2_K *y,int64_t k)

{
  block_q2_K *pbVar1;
  float *pfVar2;
  byte bVar3;
  byte bVar7;
  char cVar11;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  short sVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  undefined1 auVar21 [12];
  ulong uVar22;
  short sVar23;
  undefined1 auVar24 [16];
  ggml_half gVar25;
  anon_union_4_2_5fd15f10 fp32_1;
  uint uVar26;
  long lVar27;
  float *pfVar28;
  uint8_t *puVar29;
  ulong uVar30;
  uint8_t *puVar31;
  block_q2_K *pbVar32;
  uint8_t *puVar33;
  long lVar34;
  bool bVar35;
  anon_union_4_2_5fd15f10 fp32;
  float fVar36;
  undefined1 auVar37 [16];
  anon_union_4_2_5fd15f10 fp32_3;
  float fVar38;
  undefined1 in_XMM1 [16];
  undefined1 auVar39 [16];
  ushort uVar40;
  anon_union_4_2_5fd15f10 fp32_2;
  float fVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar44;
  float fVar48;
  float fVar49;
  float fVar50;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  uint8_t Laux [16];
  float scales [16];
  float mins [16];
  float weights [16];
  uint8_t L [256];
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  char cVar12;
  
  lVar34 = k + 0xff;
  if (-1 < k) {
    lVar34 = k;
  }
  uVar26 = (uint)((ulong)lVar34 >> 8);
  if (0 < (int)uVar26) {
    puVar33 = y->qs;
    uVar30 = 0;
    pbVar32 = y;
    do {
      pbVar1 = y + uVar30;
      lVar34 = 0;
      auVar42 = (undefined1  [16])0x0;
      pfVar28 = x;
      fVar41 = 0.0;
      do {
        lVar27 = 0;
        do {
          uVar22 = *(ulong *)(pfVar28 + lVar27 + 2);
          *(ulong *)(weights + lVar27) = *(ulong *)(pfVar28 + lVar27) & 0x7fffffff7fffffff;
          *(ulong *)(weights + lVar27 + 2) = uVar22 & 0x7fffffff7fffffff;
          lVar27 = lVar27 + 4;
        } while (lVar27 != 0x10);
        fVar36 = make_qkx2_quants(0x10,3,x + lVar34 * 0x10,weights,L + lVar34 * 0x10,mins + lVar34,
                                  Laux,-0.5,in_XMM1._0_4_,0xf,true);
        scales[lVar34] = fVar36;
        if (fVar36 <= fVar41) {
          fVar36 = fVar41;
        }
        fVar38 = mins[lVar34];
        if (fVar38 <= auVar42._0_4_) {
          fVar38 = auVar42._0_4_;
        }
        auVar21._4_8_ = 0;
        auVar21._0_4_ = fVar38;
        in_XMM1._12_4_ = 0;
        in_XMM1._0_12_ = auVar21;
        lVar34 = lVar34 + 1;
        pfVar28 = pfVar28 + 0x10;
        auVar42._12_4_ = 0;
        auVar42._0_12_ = auVar21;
        fVar41 = fVar36;
      } while (lVar34 != 0x10);
      if (fVar36 <= 0.0) {
        auVar37._0_12_ = ZEXT812(0);
        auVar37._12_4_ = 0;
        *(undefined1 (*) [16])pbVar1->scales = auVar37;
        gVar25 = 0;
      }
      else {
        fVar41 = 15.0 / fVar36;
        lVar34 = 0;
        do {
          fVar44 = scales[lVar34] * fVar41 + 12582912.0;
          fVar48 = scales[lVar34 + 1] * fVar41 + 12582912.0;
          fVar49 = scales[lVar34 + 2] * fVar41 + 12582912.0;
          fVar50 = scales[lVar34 + 3] * fVar41 + 12582912.0;
          uVar13 = SUB42(fVar44,0) & 0xff;
          uVar14 = SUB42(fVar48,0) & 0xff;
          uVar15 = SUB42(fVar49,0) & 0xff;
          uVar18 = SUB42(fVar50,0) & 0xff;
          bVar3 = (((uint)fVar44 & 0xff) != 0) * (uVar13 < 0x100) * SUB41(fVar44,0) -
                  (0xff < uVar13);
          bVar4 = (((uint)fVar48 & 0xff) != 0) * (uVar14 < 0x100) * SUB41(fVar48,0) -
                  (0xff < uVar14);
          bVar5 = (((uint)fVar49 & 0xff) != 0) * (uVar15 < 0x100) * SUB41(fVar49,0) -
                  (0xff < uVar15);
          bVar6 = (((uint)fVar50 & 0xff) != 0) * (uVar18 < 0x100) * SUB41(fVar50,0) -
                  (0xff < uVar18);
          *(uint *)(pbVar32->scales + lVar34) =
               CONCAT13((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                        CONCAT12((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5),
                                 CONCAT11((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                                          (bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3))))
          ;
          lVar34 = lVar34 + 4;
        } while (lVar34 != 0x10);
        fVar36 = fVar36 / 15.0;
        fVar41 = (float)(((uint)fVar36 & 0x7f800000) + 0x7800000);
        if ((uint)fVar36 < 0x38800000) {
          fVar41 = 2.0;
        }
        fVar41 = fVar41 + fVar36 * 5.192297e+33 * 7.70372e-34;
        gVar25 = (SUB42(fVar41,0) & 0xfff) + ((ushort)((uint)fVar41 >> 0xd) & 0x7c00);
        if (0x7f800000 < (uint)fVar36) {
          gVar25 = 0x7e00;
        }
      }
      auVar42 = _DAT_0014e5b0;
      y[uVar30].field_2.field_0.d = gVar25;
      auVar37 = _DAT_0014e730;
      if (fVar38 <= 0.0) {
        gVar25 = 0;
      }
      else {
        fVar41 = 15.0 / fVar38;
        lVar34 = 0;
        do {
          fVar36 = mins[lVar34] * fVar41 + 12582912.0;
          fVar44 = mins[lVar34 + 1] * fVar41 + 12582912.0;
          fVar48 = mins[lVar34 + 2] * fVar41 + 12582912.0;
          fVar49 = mins[lVar34 + 3] * fVar41 + 12582912.0;
          uVar13 = SUB42(fVar36,0) & 0xff;
          uVar14 = SUB42(fVar44,0) & 0xff;
          uVar15 = SUB42(fVar48,0) & 0xff;
          uVar18 = SUB42(fVar49,0) & 0xff;
          bVar3 = (((uint)fVar36 & 0xff) != 0) * (uVar13 < 0x100) * SUB41(fVar36,0) -
                  (0xff < uVar13);
          uVar40 = (ushort)bVar3;
          bVar4 = (((uint)fVar44 & 0xff) != 0) * (uVar14 < 0x100) * SUB41(fVar44,0) -
                  (0xff < uVar14);
          bVar5 = (((uint)fVar48 & 0xff) != 0) * (uVar15 < 0x100) * SUB41(fVar48,0) -
                  (0xff < uVar15);
          bVar6 = (((uint)fVar49 & 0xff) != 0) * (uVar18 < 0x100) * SUB41(fVar49,0) -
                  (0xff < uVar18);
          bVar7 = (((uint)fVar36 & 0xff) != 0) * (uVar13 < 0x100) * SUB41(fVar36,0) -
                  (0xff < uVar13);
          bVar8 = (((uint)fVar44 & 0xff) != 0) * (uVar14 < 0x100) * SUB41(fVar44,0) -
                  (0xff < uVar14);
          bVar9 = (((uint)fVar48 & 0xff) != 0) * (uVar15 < 0x100) * SUB41(fVar48,0) -
                  (0xff < uVar15);
          bVar10 = (((uint)fVar49 & 0xff) != 0) * (uVar18 < 0x100) * SUB41(fVar49,0) -
                   (0xff < uVar18);
          uVar13 = (ushort)bVar4;
          auVar43[1] = (bVar4 != 0) * (uVar13 < 0x100) * bVar4 - (0xff < uVar13);
          auVar43[0] = (bVar3 != 0) * (uVar40 < 0x100) * bVar3 - (0xff < uVar40);
          uVar14 = (ushort)bVar5;
          auVar43[2] = (bVar5 != 0) * (uVar14 < 0x100) * bVar5 - (0xff < uVar14);
          uVar15 = (ushort)bVar6;
          auVar43[3] = (bVar6 != 0) * (uVar15 < 0x100) * bVar6 - (0xff < uVar15);
          uVar18 = (ushort)bVar7;
          auVar43[4] = (bVar7 != 0) * (uVar18 < 0x100) * bVar7 - (0xff < uVar18);
          uVar17 = (ushort)bVar8;
          auVar43[5] = (bVar8 != 0) * (uVar17 < 0x100) * bVar8 - (0xff < uVar17);
          uVar19 = (ushort)bVar9;
          auVar43[6] = (bVar9 != 0) * (uVar19 < 0x100) * bVar9 - (0xff < uVar19);
          uVar20 = (ushort)bVar10;
          auVar43[7] = (bVar10 != 0) * (uVar20 < 0x100) * bVar10 - (0xff < uVar20);
          auVar43[8] = (bVar3 != 0) * (uVar40 < 0x100) * bVar3 - (0xff < uVar40);
          auVar43[9] = (bVar4 != 0) * (uVar13 < 0x100) * bVar4 - (0xff < uVar13);
          auVar43[10] = (bVar5 != 0) * (uVar14 < 0x100) * bVar5 - (0xff < uVar14);
          auVar43[0xb] = (bVar6 != 0) * (uVar15 < 0x100) * bVar6 - (0xff < uVar15);
          auVar43[0xc] = (bVar7 != 0) * (uVar18 < 0x100) * bVar7 - (0xff < uVar18);
          auVar43[0xd] = (bVar8 != 0) * (uVar17 < 0x100) * bVar8 - (0xff < uVar17);
          auVar43[0xe] = (bVar9 != 0) * (uVar19 < 0x100) * bVar9 - (0xff < uVar19);
          auVar43[0xf] = (bVar10 != 0) * (uVar20 < 0x100) * bVar10 - (0xff < uVar20);
          auVar43 = psllw(auVar43,4);
          *(uint *)(pbVar32->scales + lVar34) =
               auVar43._0_4_ & auVar42._0_4_ | *(uint *)(pbVar32->scales + lVar34);
          lVar34 = lVar34 + 4;
        } while (lVar34 != 0x10);
        fVar38 = fVar38 / 15.0;
        fVar41 = (float)(((uint)fVar38 & 0x7f800000) + 0x7800000);
        if ((uint)fVar38 < 0x38800000) {
          fVar41 = 2.0;
        }
        fVar41 = fVar41 + fVar38 * 5.192297e+33 * 7.70372e-34;
        gVar25 = (SUB42(fVar41,0) & 0xfff) + ((ushort)((uint)fVar41 >> 0xd) & 0x7c00);
        if (0x7f800000 < (uint)fVar38) {
          gVar25 = 0x7e00;
        }
      }
      y[uVar30].field_2.field_0.dmin = gVar25;
      auVar24 = _DAT_0014e760;
      auVar43 = _DAT_0014e750;
      fVar41 = ggml_table_f32_f16[y[uVar30].field_2.field_0.d];
      puVar31 = L;
      lVar34 = 0;
      pfVar28 = x;
      do {
        auVar39._0_4_ = (float)(pbVar1->scales[lVar34] & 0xf) * fVar41;
        if ((auVar39._0_4_ != 0.0) || (NAN(auVar39._0_4_))) {
          fVar36 = (float)(pbVar1->scales[lVar34] >> 4) *
                   ggml_table_f32_f16[(pbVar1->field_2).field_0.dmin];
          auVar39._4_4_ = auVar39._0_4_;
          auVar39._8_4_ = auVar39._0_4_;
          auVar39._12_4_ = auVar39._0_4_;
          lVar27 = 0;
          do {
            pfVar2 = pfVar28 + lVar27;
            auVar52._0_4_ = *pfVar2 + fVar36;
            auVar52._4_4_ = pfVar2[1] + fVar36;
            auVar52._8_4_ = pfVar2[2] + fVar36;
            auVar52._12_4_ = pfVar2[3] + fVar36;
            auVar45 = divps(auVar52,auVar39);
            fVar38 = auVar45._0_4_ + 12582912.0;
            fVar44 = auVar45._4_4_ + 12582912.0;
            auVar46._0_8_ = CONCAT44(fVar44,fVar38) & 0x7fffff007fffff;
            auVar46._8_4_ = (uint)(auVar45._8_4_ + 12582912.0) & 0x7fffff;
            auVar46._12_4_ = (uint)(auVar45._12_4_ + 12582912.0) & 0x7fffff;
            auVar51._0_4_ = -(uint)((int)((uint)fVar38 & 0x7fffff) < auVar37._0_4_);
            auVar51._4_4_ = -(uint)((int)((uint)fVar44 & 0x7fffff) < auVar37._4_4_);
            auVar51._8_4_ = -(uint)((int)auVar46._8_4_ < auVar37._8_4_);
            auVar51._12_4_ = -(uint)((int)auVar46._12_4_ < auVar37._12_4_);
            auVar52 = ~auVar51 & auVar37 | auVar46 & auVar51;
            auVar47._0_4_ = -(uint)(0x400000 < auVar52._0_4_);
            auVar47._4_4_ = -(uint)(0x400000 < auVar52._4_4_);
            auVar47._8_4_ = -(uint)(0x400000 < auVar52._8_4_);
            auVar47._12_4_ = -(uint)(0x400000 < auVar52._12_4_);
            auVar45._8_4_ = 0xff;
            auVar45._0_8_ = 0xff000000ff;
            auVar45._12_4_ = 0xff;
            auVar45 = auVar47 & auVar52 & auVar45;
            uVar13 = auVar45._0_2_;
            bVar3 = (uVar13 != 0) * (uVar13 < 0x100) * auVar45[0] - (0xff < uVar13);
            uVar13 = auVar45._4_2_;
            bVar4 = (uVar13 != 0) * (uVar13 < 0x100) * auVar45[4] - (0xff < uVar13);
            sVar16 = auVar45._8_2_;
            cVar11 = (0 < sVar16) * (sVar16 < 0x100) * auVar45[8] - (0xff < sVar16);
            sVar16 = auVar45._10_2_;
            sVar23 = CONCAT11((0 < sVar16) * (sVar16 < 0x100) * auVar45[10] - (0xff < sVar16),cVar11
                             );
            sVar16 = auVar45._12_2_;
            cVar12 = (0 < sVar16) * (sVar16 < 0x100) * auVar45[0xc] - (0xff < sVar16);
            sVar16 = auVar45._14_2_;
            sVar16 = (short)(CONCAT13((0 < sVar16) * (sVar16 < 0x100) * auVar45[0xe] -
                                      (0xff < sVar16),CONCAT12(cVar12,sVar23)) >> 0x10);
            *(uint *)(puVar31 + lVar27) =
                 CONCAT13((0 < sVar16) * (sVar16 < 0x100) * cVar12 - (0xff < sVar16),
                          CONCAT12((0 < sVar23) * (sVar23 < 0x100) * cVar11 - (0xff < sVar23),
                                   CONCAT11((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                                            (bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3))
                                  ));
            lVar27 = lVar27 + 4;
          } while (lVar27 != 0x10);
        }
        lVar34 = lVar34 + 1;
        puVar31 = puVar31 + 0x10;
        pfVar28 = pfVar28 + 0x10;
      } while (lVar34 != 0x10);
      puVar31 = L + 0x60;
      puVar29 = puVar33;
      lVar34 = 0;
      do {
        lVar27 = 0;
        do {
          auVar37 = psllw(*(undefined1 (*) [16])(puVar31 + lVar27 + -0x40),2);
          auVar39 = psllw(*(undefined1 (*) [16])(puVar31 + lVar27 + -0x20),4);
          in_XMM1 = auVar39 & auVar42;
          auVar39 = psllw(*(undefined1 (*) [16])(puVar31 + lVar27),6);
          *(undefined1 (*) [16])(puVar29 + lVar27) =
               auVar39 & auVar24 | in_XMM1 |
               auVar37 & auVar43 | *(undefined1 (*) [16])(puVar31 + lVar27 + -0x60);
          lVar27 = lVar27 + 0x10;
        } while (lVar27 != 0x20);
        puVar31 = puVar31 + 0x80;
        puVar29 = puVar29 + 0x20;
        bVar35 = lVar34 == 0;
        lVar34 = lVar34 + 0x80;
      } while (bVar35);
      x = x + 0x100;
      uVar30 = uVar30 + 1;
      pbVar32 = pbVar32 + 1;
      puVar33 = puVar33 + 0x54;
    } while (uVar30 != (uVar26 & 0x7fffffff));
  }
  return;
}

Assistant:

void quantize_row_q2_K_ref(const float * GGML_RESTRICT x, block_q2_K * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int nb = k / QK_K;

    uint8_t L[QK_K];
    uint8_t Laux[16];
    float   weights[16];
    float mins[QK_K/16];
    float scales[QK_K/16];

    const float q4scale = 15.f;

    for (int i = 0; i < nb; i++) {
        float max_scale = 0; // as we are deducting the min, scales are always positive
        float max_min = 0;
        for (int j = 0; j < QK_K/16; ++j) {
            for (int l = 0; l < 16; ++l) weights[l] = fabsf(x[16*j + l]);
            scales[j] = make_qkx2_quants(16, 3, x + 16*j, weights, L + 16*j, &mins[j], Laux, -0.5f, 0.1f, 15, true);
            float scale = scales[j];
            if (scale > max_scale) {
                max_scale = scale;
            }
            float min = mins[j];
            if (min > max_min) {
                max_min = min;
            }
        }

        if (max_scale > 0) {
            float iscale = q4scale/max_scale;
            for (int j = 0; j < QK_K/16; ++j) {
                int l = nearest_int(iscale*scales[j]);
                y[i].scales[j] = l;
            }
            y[i].d = GGML_FP32_TO_FP16(max_scale/q4scale);
        } else {
            for (int j = 0; j < QK_K/16; ++j) y[i].scales[j] = 0;
            y[i].d = GGML_FP32_TO_FP16(0.f);
        }
        if (max_min > 0) {
            float iscale = q4scale/max_min;
            for (int j = 0; j < QK_K/16; ++j) {
                int l = nearest_int(iscale*mins[j]);
                y[i].scales[j] |= (l << 4);
            }
            y[i].dmin = GGML_FP32_TO_FP16(max_min/q4scale);
        } else {
            y[i].dmin = GGML_FP32_TO_FP16(0.f);
        }
        for (int j = 0; j < QK_K/16; ++j) {
            const float d = GGML_FP16_TO_FP32(y[i].d) * (y[i].scales[j] & 0xF);
            if (!d) continue;
            const float dm = GGML_FP16_TO_FP32(y[i].dmin) * (y[i].scales[j] >> 4);
            for (int ii = 0; ii < 16; ++ii) {
                int l = nearest_int((x[16*j + ii] + dm)/d);
                l = MAX(0, MIN(3, l));
                L[16*j + ii] = l;
            }
        }

        for (int j = 0; j < QK_K; j += 128) {
            for (int l = 0; l < 32; ++l) {
                y[i].qs[j/4 + l] = L[j + l] | (L[j + l + 32] << 2) | (L[j + l + 64] << 4) | (L[j + l + 96] << 6);
            }
        }

        x += QK_K;
    }
}